

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O3

InputPartData * __thiscall Imf_3_4::MultiPartInputFile::getPart(MultiPartInputFile *this,int n)

{
  element_type *peVar1;
  pointer pPVar2;
  ulong uVar3;
  ostream *poVar4;
  ArgExc *this_00;
  ulong uVar5;
  stringstream _iex_throw_s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  uVar3 = (ulong)(uint)n;
  if ((-1 < n) &&
     (peVar1 = (this->_data).
               super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,
     pPVar2 = (peVar1->parts).
              super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
              ._M_impl.super__Vector_impl_data._M_start,
     uVar5 = ((long)(peVar1->parts).
                    super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 5) *
             -0x5555555555555555, uVar3 <= uVar5 && uVar5 - uVar3 != 0)) {
    return &pPVar2[uVar3].data;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"MultiPartInputFile::getPart called with invalid part ",0x35);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_190,n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," on file with ",0xe);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," parts",6);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

InputPartData*
MultiPartInputFile::getPart (int n) const
{
    if (n < 0 || static_cast<size_t> (n) >= _data->parts.size ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartInputFile::getPart called with invalid part "
                << n << " on file with " << _data->parts.size () << " parts");
    }
    return &(_data->parts[n].data);
}